

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O3

void gpu_free_error_queue(void)

{
  GPU_ErrorObject *pGVar1;
  long lVar2;
  ulong uVar3;
  
  if (_gpu_error_code_queue_size != 0) {
    lVar2 = 0;
    uVar3 = 0;
    pGVar1 = _gpu_error_code_queue;
    do {
      SDL_free(*(undefined8 *)((long)&pGVar1->function + lVar2));
      pGVar1 = _gpu_error_code_queue;
      *(undefined8 *)((long)&_gpu_error_code_queue->function + lVar2) = 0;
      SDL_free(*(undefined8 *)((long)&pGVar1->details + lVar2));
      pGVar1 = _gpu_error_code_queue;
      *(undefined8 *)((long)&_gpu_error_code_queue->details + lVar2) = 0;
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x18;
    } while (uVar3 < _gpu_error_code_queue_size);
  }
  SDL_free();
  _gpu_error_code_queue = (GPU_ErrorObject *)0x0;
  _gpu_num_error_codes = 0;
  SDL_free(_gpu_error_code_result.function);
  _gpu_error_code_result.function = (char *)0x0;
  SDL_free(_gpu_error_code_result.details);
  _gpu_error_code_result.details = (char *)0x0;
  return;
}

Assistant:

void gpu_free_error_queue(void)
{
    unsigned int i;
    // Free the error queue
    for(i = 0; i < _gpu_error_code_queue_size; i++)
    {
        SDL_free(_gpu_error_code_queue[i].function);
        _gpu_error_code_queue[i].function = NULL;
        SDL_free(_gpu_error_code_queue[i].details);
        _gpu_error_code_queue[i].details = NULL;
    }
    SDL_free(_gpu_error_code_queue);
    _gpu_error_code_queue = NULL;
    _gpu_num_error_codes = 0;

    SDL_free(_gpu_error_code_result.function);
    _gpu_error_code_result.function = NULL;
    SDL_free(_gpu_error_code_result.details);
    _gpu_error_code_result.details = NULL;
}